

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.cpp
# Opt level: O0

bool __thiscall hwnet::TCPListener::_start(TCPListener *this,OnNewConn *onNewConn,OnError *onError)

{
  Poller *this_00;
  int iVar1;
  socklen_t __len;
  sockaddr *__addr;
  enable_shared_from_this<hwnet::TCPListener> local_48;
  shared_ptr<hwnet::Channel> local_38;
  OnError *local_28;
  OnError *onError_local;
  OnNewConn *onNewConn_local;
  TCPListener *this_local;
  
  local_28 = onError;
  onError_local = (OnError *)onNewConn;
  onNewConn_local = (OnNewConn *)this;
  iVar1 = Addr::Family(&this->addr);
  iVar1 = socket(iVar1,1,6);
  this->fd = iVar1;
  if (-1 < this->fd) {
    SetNoBlock(this->fd,true);
    ReuseAddr(this->fd);
    iVar1 = this->fd;
    __addr = Addr::Address(&this->addr);
    __len = Addr::AddrLen(&this->addr);
    iVar1 = bind(iVar1,(sockaddr *)__addr,__len);
    if (iVar1 == 0) {
      iVar1 = listen(this->fd,0x1000);
      if (iVar1 == 0) {
        std::function<void_(const_std::shared_ptr<hwnet::TCPListener>_&,_int,_const_hwnet::Addr_&)>
        ::operator=(&this->onNewConn_,
                    (function<void_(const_std::shared_ptr<hwnet::TCPListener>_&,_int,_const_hwnet::Addr_&)>
                     *)onError_local);
        std::function<void_(const_std::shared_ptr<hwnet::TCPListener>_&,_int)>::operator=
                  (&this->onError_,local_28);
        this_00 = this->poller_;
        std::enable_shared_from_this<hwnet::TCPListener>::shared_from_this(&local_48);
        std::shared_ptr<hwnet::Channel>::shared_ptr<hwnet::TCPListener,void>
                  (&local_38,(shared_ptr<hwnet::TCPListener> *)&local_48);
        Poller::Add(this_00,&local_38,10);
        std::shared_ptr<hwnet::Channel>::~shared_ptr(&local_38);
        std::shared_ptr<hwnet::TCPListener>::~shared_ptr
                  ((shared_ptr<hwnet::TCPListener> *)&local_48);
      }
      else {
        close(this->fd);
        this->fd = -1;
      }
    }
    else {
      close(this->fd);
      this->fd = -1;
    }
  }
  return false;
}

Assistant:

bool TCPListener::_start(const OnNewConn &onNewConn,const OnError &onError) {
	this->fd = ::socket(this->addr.Family(),SOCK_STREAM,IPPROTO_TCP);
	
	if(this->fd < 0){
		return false;
	}

	SetNoBlock(this->fd,true);

	ReuseAddr(this->fd);

	if(0 != bind(this->fd,addr.Address(),addr.AddrLen())) {
        ::close(this->fd);
        this->fd = -1;
		return false;
	}
	
	if(0 != listen(this->fd,SOMAXCONN)) {
		::close(this->fd);
		this->fd = -1;
		return false;
	}

	this->onNewConn_ = onNewConn;
	this->onError_   = onError;
	this->poller_->Add(shared_from_this(),Poller::Read | Poller::ET);
	return false;
}